

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall argo::json::json(json *this,type t)

{
  json_exception *this_00;
  type t_local;
  json *this_local;
  
  this->m_type = t;
  json_value::json_value((json_value *)&(this->m_value).u_object);
  std::__cxx11::string::string((string *)&this->m_raw_value);
  switch(this->m_type) {
  case object_e:
    construct_object(this);
    break;
  case array_e:
    construct_array(this);
    break;
  case boolean_e:
    (this->m_value).u_boolean = false;
    break;
  case null_e:
    break;
  case number_int_e:
    (this->m_value).u_number_int = 0;
    break;
  case number_double_e:
    (this->m_value).u_array.
    super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    break;
  case string_e:
    construct_string(this);
    break;
  default:
    this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
    json_exception::json_exception(this_00,invalid_json_type_e);
    __cxa_throw(this_00,&json_exception::typeinfo,json_exception::~json_exception);
  }
  return;
}

Assistant:

json::json(type t) : m_type(t)
{
    switch (m_type)
    {
    case object_e:
        construct_object();
        break;
    case array_e:
        construct_array();
        break;
    case string_e:
        construct_string();
        break;
    case boolean_e:
        m_value.u_boolean = false;
        break;
    case number_int_e:
        m_value.u_number_int = 0;
        break;
    case number_double_e:
        m_value.u_number_double = 0;
        break;
    case null_e:
        break;
    default:
        throw json_exception(json_exception::invalid_json_type_e);
        break;
    }
}